

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void OpenSteer::OpenSteerDemo::position2dCamera
               (AbstractVehicle *selected,float distance,float elevation)

{
  Vec3 VVar1;
  Vec3 position3d;
  float in_stack_00000078;
  float in_stack_0000007c;
  AbstractVehicle *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffbc;
  float local_28;
  float local_20;
  
  position3dCamera(in_stack_00000080,in_stack_0000007c,in_stack_00000078);
  VVar1 = LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::position(&camera.super_LocalSpace);
  local_28 = VVar1.z;
  local_20 = VVar1.x;
  VVar1.y = (float)in_stack_ffffffffffffffbc;
  VVar1.x = local_28;
  VVar1.z = local_20;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setPosition
            ((LocalSpaceMixin<OpenSteer::AbstractLocalSpace> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),VVar1);
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::position2dCamera (AbstractVehicle& selected,
                                            float distance,
                                            float elevation)
{
    // position the camera as if in 3d:
    position3dCamera (selected, distance, elevation);

    // then adjust for 3d:
    Vec3 position3d = camera.position();
    position3d.y += elevation;
    camera.setPosition (position3d);
}